

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterInit(Fts5Index *p,Fts5StructureSegment *pSeg,Fts5SegIter *pIter)

{
  Fts5SegIter *pIter_local;
  Fts5StructureSegment *pSeg_local;
  Fts5Index *p_local;
  
  if (pSeg->pgnoFirst != 0) {
    if (p->rc == 0) {
      memset(pIter,0,0x78);
      fts5SegIterSetNext(p,pIter);
      pIter->pSeg = pSeg;
      pIter->iLeafPgno = pSeg->pgnoFirst + -1;
      fts5SegIterNextPage(p,pIter);
    }
    if (p->rc == 0) {
      pIter->iLeafOffset = 4;
      pIter->iPgidxOff = pIter->pLeaf->szLeaf + 1;
      fts5SegIterLoadTerm(p,pIter,0);
      fts5SegIterLoadNPos(p,pIter);
    }
  }
  return;
}

Assistant:

static void fts5SegIterInit(
  Fts5Index *p,                   /* FTS index object */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  if( pSeg->pgnoFirst==0 ){
    /* This happens if the segment is being used as an input to an incremental
    ** merge and all data has already been "trimmed". See function
    ** fts5TrimSegments() for details. In this case leave the iterator empty.
    ** The caller will see the (pIter->pLeaf==0) and assume the iterator is
    ** at EOF already. */
    assert( pIter->pLeaf==0 );
    return;
  }

  if( p->rc==SQLITE_OK ){
    memset(pIter, 0, sizeof(*pIter));
    fts5SegIterSetNext(p, pIter);
    pIter->pSeg = pSeg;
    pIter->iLeafPgno = pSeg->pgnoFirst-1;
    fts5SegIterNextPage(p, pIter);
  }

  if( p->rc==SQLITE_OK ){
    pIter->iLeafOffset = 4;
    assert_nc( pIter->pLeaf->nn>4 );
    assert_nc( fts5LeafFirstTermOff(pIter->pLeaf)==4 );
    pIter->iPgidxOff = pIter->pLeaf->szLeaf+1;
    fts5SegIterLoadTerm(p, pIter, 0);
    fts5SegIterLoadNPos(p, pIter);
  }
}